

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdNarrow<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<int,(unsigned_char)4>>
          (Thread *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Value VVar7;
  Value VVar8;
  
  VVar7 = Pop(this);
  VVar8 = Pop(this);
  auVar3._0_4_ = -(uint)(0 < (int)VVar8.i32_);
  auVar3._4_4_ = -(uint)(0 < VVar8._4_4_);
  auVar3._8_4_ = -(uint)(0 < VVar8._8_4_);
  auVar3._12_4_ = -(uint)(0 < VVar8._12_4_);
  auVar3 = auVar3 & (undefined1  [16])VVar8;
  auVar6._0_4_ = -(uint)(auVar3._0_4_ < 0xffff);
  auVar6._4_4_ = -(uint)(auVar3._4_4_ < 0xffff);
  auVar6._8_4_ = -(uint)(auVar3._8_4_ < 0xffff);
  auVar6._12_4_ = -(uint)(auVar3._12_4_ < 0xffff);
  auVar4._8_4_ = 0xffffffff;
  auVar4._0_8_ = 0xffffffffffffffff;
  auVar4._12_4_ = 0xffffffff;
  auVar4 = pshuflw(auVar3 & auVar6,auVar6 ^ auVar4 | auVar3 & auVar6,0xe8);
  auVar4 = pshufhw(auVar4,auVar4,0xe8);
  VVar8.i64_._4_4_ = auVar4._8_4_;
  VVar8.i32_ = auVar4._0_4_;
  auVar5._0_4_ = -(uint)(0 < (int)VVar7.i32_);
  auVar5._4_4_ = -(uint)(0 < VVar7._4_4_);
  auVar5._8_4_ = -(uint)(0 < VVar7._8_4_);
  auVar5._12_4_ = -(uint)(0 < VVar7._12_4_);
  auVar5 = auVar5 & (undefined1  [16])VVar7;
  auVar2._0_4_ = -(uint)(auVar5._0_4_ < 0xffff);
  auVar2._4_4_ = -(uint)(auVar5._4_4_ < 0xffff);
  auVar2._8_4_ = -(uint)(auVar5._8_4_ < 0xffff);
  auVar2._12_4_ = -(uint)(auVar5._12_4_ < 0xffff);
  auVar1._8_4_ = 0xffffffff;
  auVar1._0_8_ = 0xffffffffffffffff;
  auVar1._12_4_ = 0xffffffff;
  auVar4 = pshuflw((undefined1  [16])0x0,auVar2 ^ auVar1 | auVar5 & auVar2,0xe8);
  auVar4 = pshufhw(auVar4,auVar4,0xe8);
  VVar8._12_4_ = auVar4._8_4_;
  VVar8._8_4_ = auVar4._0_4_;
  Push(this,VVar8);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdNarrow() {
  using SL = typename S::LaneType;
  using TL = typename T::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < T::lanes; ++i) {
    result.v[i] = Saturate<SL, TL>(lhs.v[i]);
  }
  for (u8 i = 0; i < T::lanes; ++i) {
    result.v[T::lanes + i] = Saturate<SL, TL>(rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}